

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.h
# Opt level: O0

void __thiscall
Js::JSONStringifier::PropertyListElement::PropertyListElement
          (PropertyListElement *this,PropertyListElement *other)

{
  PropertyRecord **ppPVar1;
  JavascriptString **ppJVar2;
  PropertyListElement *other_local;
  PropertyListElement *this_local;
  
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__((WriteBarrierPtr *)other);
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::WriteBarrierPtr(&this->propertyRecord,*ppPVar1)
  ;
  ppJVar2 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptString__
                      ((WriteBarrierPtr *)&other->propertyName);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierPtr(&this->propertyName,*ppJVar2);
  return;
}

Assistant:

PropertyListElement(const PropertyListElement& other)
            : propertyRecord(other.propertyRecord), propertyName(other.propertyName)
        {}